

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibraryinfo.cpp
# Opt level: O2

QString * __thiscall
QLibraryInfoPrivate::path
          (QString *__return_storage_ptr__,QLibraryInfoPrivate *this,LibraryPath p,
          UsageMode usageMode)

{
  QArrayDataPointer<char16_t> *other;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<QString> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  paths((QStringList *)&local_38,this,p,usageMode);
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  other = &local_58;
  if (local_38.size != 0) {
    other = &(local_38.ptr)->d;
  }
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,other);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLibraryInfoPrivate::path(QLibraryInfo::LibraryPath p, UsageMode usageMode)
{
    return paths(p, usageMode).value(0, QString());
}